

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O0

void __thiscall
cmExternalMakefileProjectGenerator::~cmExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGenerator *this)

{
  code *pcVar1;
  cmExternalMakefileProjectGenerator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~cmExternalMakefileProjectGenerator() {}